

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

string * __thiscall
ot::commissioner::Interpreter::ToString_abi_cxx11_
          (string *__return_storage_ptr__,Interpreter *this,Timestamp *aTimestamp)

{
  pointer pbVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  ulong uVar5;
  long *plVar6;
  char cVar7;
  uint uVar8;
  ulong __val;
  string __str_2;
  string __str;
  long *local_98;
  long local_88;
  long lStack_80;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  char *local_58;
  uint local_50;
  char local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  __val = (ulong)(this->mContext).mNwkAliases.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start & 0xffffffffffff;
  cVar7 = '\x01';
  if (9 < __val) {
    uVar5 = __val;
    cVar3 = '\x04';
    do {
      cVar7 = cVar3;
      if (uVar5 < 100) {
        cVar7 = cVar7 + -2;
        goto LAB_002554aa;
      }
      if (uVar5 < 1000) {
        cVar7 = cVar7 + -1;
        goto LAB_002554aa;
      }
      if (uVar5 < 10000) goto LAB_002554aa;
      bVar2 = 99999 < uVar5;
      uVar5 = uVar5 / 10000;
      cVar3 = cVar7 + '\x04';
    } while (bVar2);
    cVar7 = cVar7 + '\x01';
  }
LAB_002554aa:
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_58,local_50,__val);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x30078a);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar6;
    local_98 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  uVar8 = *(ushort *)
           ((long)&(this->mContext).mNwkAliases.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + 6) & 0x7fff;
  cVar7 = '\x01';
  if (((9 < (ulong)uVar8) && (cVar7 = '\x02', 99 < uVar8)) && (cVar7 = '\x03', 999 < uVar8)) {
    cVar7 = '\x05' - (uVar8 < 10000);
  }
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,cVar7);
  std::__detail::__to_chars_10_impl<unsigned_long>(local_58,local_50,(ulong)uVar8);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x300793);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_78);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar6;
    local_98 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  pbVar1 = (this->mContext).mNwkAliases.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,'\x01');
  std::__detail::__to_chars_10_impl<unsigned_long>
            ((char *)local_78,(uint)local_70,(ulong)pbVar1 >> 0x3f);
  plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_78,0,(char *)0x0,0x30079a);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_88 = *plVar6;
    lStack_80 = plVar4[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar6;
    local_98 = (long *)*plVar4;
  }
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Interpreter::ToString(const Timestamp &aTimestamp)
{
    std::string ret;
    ret += "seconds=" + std::to_string(aTimestamp.mSeconds) + "\n";
    ret += "ticks=" + std::to_string(aTimestamp.mTicks) + "\n";
    ret += "u=" + std::to_string(aTimestamp.mU);
    return ret;
}